

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

void __thiscall xLearn::InmemReader::init_from_binary(InmemReader *this)

{
  undefined1 auVar1 [64];
  uint uVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  DMatrix::Deserialize(&this->data_buf_,&(this->super_Reader).filename_);
  (this->super_Reader).has_label_ = (this->data_buf_).has_label;
  uVar2 = (this->data_buf_).row_length;
  this->num_samples_ = uVar2;
  DMatrix::ReAlloc(&(this->super_Reader).data_samples_,(ulong)uVar2,true);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->order_,(ulong)this->num_samples_);
  puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar4 != 0) {
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar8 = vpmovsxbd_avx512f(_DAT_0015a560);
    auVar9 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar10 = vpbroadcastd_avx512f(ZEXT416(0x10));
    lVar4 = lVar4 >> 2;
    auVar11 = vpbroadcastq_avx512f();
    uVar5 = 0;
    do {
      vpcmpuq_avx512f(auVar7,auVar11,2);
      vpcmpuq_avx512f(auVar6,auVar11,2);
      auVar7 = vpaddq_avx512f(auVar7,auVar9);
      auVar6 = vpaddq_avx512f(auVar6,auVar9);
      auVar1 = vmovdqu32_avx512f(auVar8);
      *(undefined1 (*) [64])(puVar3 + uVar5) = auVar1;
      uVar5 = uVar5 + 0x10;
      auVar8 = vpaddd_avx512f(auVar8,auVar10);
    } while ((lVar4 + (ulong)(lVar4 == 0) + 0xf & 0xfffffffffffffff0) != uVar5);
  }
  return;
}

Assistant:

void InmemReader::init_from_binary() {
  // Init data_buf_                               
  data_buf_.Deserialize(filename_);
  has_label_ = data_buf_.has_label;
  // Init data_samples_
  num_samples_ = data_buf_.row_length;
  data_samples_.ReAlloc(num_samples_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
}